

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManPrintQuit(Lf_Man_t *p,Gia_Man_t *pNew)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Man_t *pGVar5;
  Vec_Mem_t *pVVar6;
  Vec_Int_t *pVVar7;
  Jf_Par_t *pJVar8;
  long lVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  double dVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  int CountOver [2];
  timespec local_28;
  
  dVar19 = Gia_ManMemory(p->pGia);
  pGVar5 = p->pGia;
  pVVar6 = p->vTtMem;
  iVar15 = pGVar5->nObjs;
  fVar22 = 0.0;
  fVar21 = 0.0;
  if (pVVar6 != (Vec_Mem_t *)0x0) {
    fVar21 = ((float)pVVar6->nPageAlloc * 8.0 +
              (float)(pVVar6->iPage + 1) *
              (float)(1 << ((byte)pVVar6->LogPageSze & 0x1f)) * (float)pVVar6->nEntrySize * 8.0 +
             48.0) * 9.536743e-07;
  }
  pVVar7 = pNew->vMapping;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    iVar14 = pVVar7->nCap;
    auVar20._8_4_ = iVar14 >> 0x1f;
    auVar20._0_8_ = (long)iVar14;
    auVar20._12_4_ = 0x45300000;
    fVar22 = (float)((((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar14) - 4503599627370496.0)) * 4.0 + 16.0) *
                    9.5367431640625e-07);
  }
  iVar14 = (~(pGVar5->vCos->nSize + pGVar5->vCis->nSize) + iVar15) - pGVar5->nBufs;
  if ((p->CutCount[0] == 0.0) && (!NAN(p->CutCount[0]))) {
    p->CutCount[0] = 1.0;
  }
  pJVar8 = p->pPars;
  if (pJVar8->fVerbose == 0) {
    local_28.tv_sec = 0;
    iVar15 = pJVar8->fCutGroup;
    iVar14 = pJVar8->nLutSize / 2;
    if (iVar15 == 0) {
      iVar14 = pJVar8->nLutSize;
    }
    iVar2 = pNew->nObjs;
    if (1 < (long)iVar2) {
      uVar3 = pVVar7->nSize;
      uVar16 = 1;
      if (1 < (int)uVar3) {
        uVar16 = (ulong)uVar3;
      }
      uVar17 = 1;
      do {
        if (uVar16 == uVar17) {
LAB_00765c66:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = pVVar7->pArray[uVar17];
        if ((ulong)uVar4 != 0) {
          if (((int)uVar4 < 0) || ((int)uVar3 <= (int)uVar4)) goto LAB_00765c66;
          piVar1 = (int *)((long)&local_28.tv_sec + (ulong)(iVar14 < pVVar7->pArray[uVar4]) * 4);
          *piVar1 = *piVar1 + 1;
        }
        uVar17 = uVar17 + 1;
      } while ((long)iVar2 != uVar17);
    }
    if (iVar15 != 0) {
      printf("Created %d regular %d-LUTs and %d dual %d-LUTs. The total of %d %d-LUTs.\n");
    }
  }
  else {
    fVar12 = (float)iVar14 * 32.0 * 9.536743e-07 +
             (float)((p->vStoreOld).vPages.nSize + (p->vFreePages).nSize) *
             (float)((p->vStoreOld).MaskPage + 1) * 9.536743e-07;
    fVar11 = (float)(iVar14 * 3 + iVar15 * 2) * 4.0 * 9.536743e-07;
    fVar13 = (float)(p->vMemSets).nSize * (float)p->nSetWords * 8.0 * 4096.0 * 9.536743e-07;
    printf("CutPair = %.0f  ",p->CutCount[0]);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar19 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar11);
    printf("Best = %.2f MB  ",(double)fVar12);
    printf("Front = %.2f MB   ",(double)fVar13);
    printf("Map = %.2f MB  ",(double)fVar22);
    printf("TT = %.2f MB  ",(double)fVar21);
    printf("Total = %.2f MB",
           (double)((float)(dVar19 * 9.5367431640625e-07) + fVar11 + fVar12 + fVar13 + fVar22 +
                   fVar21));
    putchar(10);
    if (-1 < p->pPars->nLutSize) {
      uVar16 = 0;
      do {
        printf("%d:%d  ",uVar16 & 0xffffffff,(ulong)(uint)p->nCutCounts[uVar16]);
        bVar10 = (long)uVar16 < (long)p->pPars->nLutSize;
        uVar16 = uVar16 + 1;
      } while (bVar10);
    }
    pGVar5 = p->pGia;
    printf("Equal = %d (%.0f %%) ",
           (((double)p->nCutEqual * 100.0) / (double)p->Iter) /
           (double)((~(pGVar5->vCos->nSize + pGVar5->vCis->nSize) + pGVar5->nObjs) - pGVar5->nBufs))
    ;
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      printf("TT = %d (%.2f %%)  ",((double)p->vTtMem->nEntries * 100.0) / p->CutCount[2]);
    }
    if (p->pGia->pMuxes != (uint *)0x0) {
      if (p->nCutMux != 0) {
        printf("MuxTT = %d (%.0f %%) ",
               (((double)p->nCutMux * 100.0) / (double)p->Iter) / (double)p->pGia->nMuxes);
      }
    }
    putchar(10);
    printf("CoDrvs = %d (%.2f %%)  ",((double)p->nCoDrivers * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    printf("CoInvs = %d (%.2f %%)  ",((double)p->nInverters * 100.0) / (double)p->pGia->vCos->nSize)
    ;
    pGVar5 = p->pGia;
    printf("Front = %d (%.2f %%)  ",
           ((double)p->nFrontMax * 100.0) /
           (double)(~(pGVar5->vCos->nSize + pGVar5->vCis->nSize) + pGVar5->nObjs));
    printf("TimeFails = %d   ",(ulong)(uint)p->nTimeFails);
    iVar15 = clock_gettime(3,&local_28);
    if (iVar15 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    lVar9 = p->clkStart;
    Abc_Print(1,"%s =","Time");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar18 - lVar9) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Lf_ManPrintQuit( Lf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(int) * (2 * Gia_ManObjNum(p->pGia) + 3 * Gia_ManAndNotBufNum(p->pGia)) / (1<<20); // offset, required, cutsets, maprefs, flowrefs
    float MemCutsB = 1.0 * (p->vStoreOld.MaskPage + 1) * (Vec_PtrSize(&p->vFreePages) + Vec_PtrSize(&p->vStoreOld.vPages)) / (1<<20) + 1.0 * sizeof(Lf_Bst_t) * Gia_ManAndNotBufNum(p->pGia) / (1<<20);
    float MemCutsF = 1.0 * sizeof(word) * p->nSetWords * (1<<LF_LOG_PAGE) * Vec_PtrSize(&p->vMemSets) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
    {
        int i, CountOver[2] = {0};
        int nLutSize = p->pPars->fCutGroup ? p->pPars->nLutSize/2 : p->pPars->nLutSize;
        Gia_ManForEachLut( pNew, i )
            CountOver[Gia_ObjLutSize(pNew, i) > nLutSize]++;
        if ( p->pPars->fCutGroup )
            printf( "Created %d regular %d-LUTs and %d dual %d-LUTs. The total of %d %d-LUTs.\n", 
            CountOver[0], nLutSize, CountOver[1], nLutSize, CountOver[0] + 2*CountOver[1], nLutSize );
        return;
    }
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Best = %.2f MB  ",         MemCutsB );
    printf( "Front = %.2f MB   ",       MemCutsF );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCutsB + MemCutsF + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d:%d  ", i, p->nCutCounts[i] );
        printf( "Equal = %d (%.0f %%) ", p->nCutEqual, 100.0 * p->nCutEqual / p->Iter / Gia_ManAndNotBufNum(p->pGia) );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        if ( p->pGia->pMuxes && p->nCutMux )
            printf( "MuxTT = %d (%.0f %%) ", p->nCutMux, 100.0 * p->nCutMux / p->Iter / Gia_ManMuxNum(p->pGia) );
        printf( "\n" );
    }
    printf( "CoDrvs = %d (%.2f %%)  ",  p->nCoDrivers, 100.0*p->nCoDrivers/Gia_ManCoNum(p->pGia) );
    printf( "CoInvs = %d (%.2f %%)  ",  p->nInverters, 100.0*p->nInverters/Gia_ManCoNum(p->pGia) );
    printf( "Front = %d (%.2f %%)  ",   p->nFrontMax,  100.0*p->nFrontMax/Gia_ManAndNum(p->pGia) );
    printf( "TimeFails = %d   ",        p->nTimeFails );
    Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    fflush( stdout );
}